

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QVariant_(*)(const_void_*,_const_void_*,_double)>::resize
          (QList<QVariant_(*)(const_void_*,_const_void_*,_double)> *this,qsizetype size)

{
  qsizetype qVar1;
  QArrayDataPointer<QVariant_(*)(const_void_*,_const_void_*,_double)> *in_RSI;
  QArrayDataPointer<QVariant_(*)(const_void_*,_const_void_*,_double)> *in_RDI;
  QList<QVariant_(*)(const_void_*,_const_void_*,_double)> *unaff_retaddr;
  QArrayDataPointer<QVariant_(*)(const_void_*,_const_void_*,_double)> *this_00;
  
  resize_internal(unaff_retaddr,(qsizetype)in_RDI);
  this_00 = in_RSI;
  qVar1 = QList<QVariant_(*)(const_void_*,_const_void_*,_double)>::size
                    ((QList<QVariant_(*)(const_void_*,_const_void_*,_double)> *)in_RDI);
  if (qVar1 < (long)in_RSI) {
    QArrayDataPointer<QVariant_(*)(const_void_*,_const_void_*,_double)>::operator->(in_RDI);
    QArrayDataPointer<QVariant_(*)(const_void_*,_const_void_*,_double)>::appendInitialize
              (this_00,(qsizetype)in_RSI);
  }
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }